

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_impl.h
# Opt level: O3

void bench_schnorrsig_verify(void *arg,int iters)

{
  int iVar1;
  ulong uVar2;
  secp256k1_xonly_pubkey pk;
  undefined1 local_60 [64];
  
  if (0 < iters) {
    uVar2 = 0;
    do {
      iVar1 = secp256k1_xonly_pubkey_parse
                        (*arg,local_60,*(undefined8 *)(*(long *)((long)arg + 0x18) + uVar2 * 8));
      if (iVar1 != 1) {
        bench_schnorrsig_verify_cold_1();
LAB_00103ff6:
        bench_schnorrsig_verify_cold_2();
        halt_baddata();
      }
      iVar1 = secp256k1_schnorrsig_verify
                        (*arg,*(undefined8 *)(*(long *)((long)arg + 0x20) + uVar2 * 8),
                         *(undefined8 *)(*(long *)((long)arg + 0x28) + uVar2 * 8),0x20,local_60);
      if (iVar1 == 0) goto LAB_00103ff6;
      uVar2 = uVar2 + 1;
    } while ((uint)iters != uVar2);
  }
  return;
}

Assistant:

static void bench_schnorrsig_verify(void* arg, int iters) {
    bench_schnorrsig_data *data = (bench_schnorrsig_data *)arg;
    int i;

    for (i = 0; i < iters; i++) {
        secp256k1_xonly_pubkey pk;
        CHECK(secp256k1_xonly_pubkey_parse(data->ctx, &pk, data->pk[i]) == 1);
        CHECK(secp256k1_schnorrsig_verify(data->ctx, data->sigs[i], data->msgs[i], MSGLEN, &pk));
    }
}